

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O2

void __thiscall
cornerstone::raft_server::handle_install_snapshot_resp(raft_server *this,resp_msg *resp)

{
  element_type *peVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  iterator iVar6;
  char *pcVar7;
  undefined4 extraout_var;
  mutex *__mutex;
  ptr<peer> p;
  ptr<snapshot_sync_ctx> sync_ctx;
  shared_lock<std::shared_timed_mutex> rlock;
  ptr<snapshot> nil_snp;
  allocator<char> local_e9;
  __shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2> local_e8;
  string local_d8 [32];
  __shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> local_b8;
  shared_lock<std::shared_timed_mutex> local_a8;
  undefined1 local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_90 [12];
  char *local_30;
  
  local_a8._M_pm = &this->peers_lock_;
  local_a8._M_owns = true;
  std::__shared_mutex_pthread::lock_shared(&(local_a8._M_pm)->super___shared_timed_mutex_base);
  local_98._0_4_ = (resp->super_msg_base).src_;
  iVar6 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->peers_)._M_h,(key_type_conflict *)local_98);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>.
      _M_cur == (__node_type *)0x0) {
    peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_30 = "the response is from an unkonw peer %d";
    pcVar7 = strfmt<100>::fmt<int>((strfmt<100> *)local_98,(resp->super_msg_base).src_);
    std::__cxx11::string::string<std::allocator<char>>(local_d8,pcVar7,(allocator<char> *)&local_e8)
    ;
    (*peVar1->_vptr_logger[3])(peVar1,local_d8);
    std::__cxx11::string::~string(local_d8);
  }
  else {
    std::__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e8,
               (__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)iVar6.
                      super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                      ._M_cur + 0x10));
    if (resp->accepted_ == true) {
      __mutex = &(local_e8._M_ptr)->lock_;
      std::mutex::lock(__mutex);
      std::__shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_b8,
                 &((local_e8._M_ptr)->snp_sync_ctx_).
                  super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>);
      if (local_b8._M_ptr == (element_type *)0x0) {
        peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_98,"no snapshot sync context for this peer, drop the response",
                   (allocator<char> *)local_d8);
        (*peVar1->_vptr_logger[3])(peVar1,local_98);
        std::__cxx11::string::~string((string *)local_98);
        bVar4 = true;
      }
      else {
        peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (resp->next_idx_ <
            (((local_b8._M_ptr)->snapshot_).
             super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->size_) {
          local_30 = "continue to sync snapshot at offset %llu";
          pcVar7 = strfmt<100>::fmt<unsigned_long>((strfmt<100> *)local_98,resp->next_idx_);
          std::__cxx11::string::string<std::allocator<char>>(local_d8,pcVar7,&local_e9);
          (*peVar1->_vptr_logger[2])(peVar1,local_d8);
          std::__cxx11::string::~string(local_d8);
          (local_b8._M_ptr)->offset_ = resp->next_idx_;
          bVar4 = false;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_98,"snapshot sync is done",(allocator<char> *)local_d8);
          (*peVar1->_vptr_logger[2])(peVar1,local_98);
          std::__cxx11::string::~string((string *)local_98);
          local_98 = (undefined1  [8])0x0;
          a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          uVar2 = (((local_b8._M_ptr)->snapshot_).
                   super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  last_log_idx_;
          (local_e8._M_ptr)->next_log_idx_ = uVar2 + 1;
          (local_e8._M_ptr)->matched_idx_ = uVar2;
          peer::set_snapshot_in_sync(local_e8._M_ptr,(ptr<snapshot> *)local_98);
          bVar4 = peer::clear_pending_commit(local_e8._M_ptr);
          if (bVar4) {
            bVar4 = false;
          }
          else {
            uVar3 = resp->next_idx_;
            iVar5 = (*((this->log_store_).
                       super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->_vptr_log_store[2])();
            bVar4 = CONCAT44(extraout_var,iVar5) <= uVar3;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_90);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    else {
      peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,"peer declines to install the snapshot, will retry",
                 (allocator<char> *)local_d8);
      (*peVar1->_vptr_logger[3])(peVar1,local_98);
      std::__cxx11::string::~string((string *)local_98);
      bVar4 = false;
    }
    if ((!bVar4) && (this->role_ == leader)) {
      request_append_entries(this,local_e8._M_ptr);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  }
  std::shared_lock<std::shared_timed_mutex>::~shared_lock(&local_a8);
  return;
}

Assistant:

void raft_server::handle_install_snapshot_resp(resp_msg& resp)
{
    read_lock(peers_lock_);
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end())
    {
        l_->info(sstrfmt("the response is from an unkonw peer %d").fmt(resp.get_src()));
        return;
    }

    // if there are pending logs to be synced or commit index need to be advanced, continue to send appendEntries to
    // this peer
    bool need_to_catchup = true;
    ptr<peer> p = it->second;
    if (resp.get_accepted())
    {
        std::lock_guard<std::mutex> guard(p->get_lock());
        ptr<snapshot_sync_ctx> sync_ctx = p->get_snapshot_sync_ctx();
        if (sync_ctx == nilptr)
        {
            l_->info("no snapshot sync context for this peer, drop the response");
            need_to_catchup = false;
        }
        else
        {
            if (resp.get_next_idx() >= sync_ctx->get_snapshot()->size())
            {
                l_->debug("snapshot sync is done");
                ptr<snapshot> nil_snp;
                p->set_next_log_idx(sync_ctx->get_snapshot()->get_last_log_idx() + 1);
                p->set_matched_idx(sync_ctx->get_snapshot()->get_last_log_idx());
                p->set_snapshot_in_sync(nil_snp);
                need_to_catchup = p->clear_pending_commit() || resp.get_next_idx() < log_store_->next_slot();
            }
            else
            {
                l_->debug(sstrfmt("continue to sync snapshot at offset %llu").fmt(resp.get_next_idx()));
                sync_ctx->set_offset(resp.get_next_idx());
            }
        }
    }
    else
    {
        l_->info("peer declines to install the snapshot, will retry");
    }

    // This may not be a leader anymore, such as the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader && need_to_catchup)
    {
        request_append_entries(*p);
    }
}